

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatchkit.hpp
# Opt level: O3

Result_Type __thiscall
chaiscript::detail::Dispatch_Engine::
boxed_cast<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>>
          (Dispatch_Engine *this,Boxed_Value *bv)

{
  _Map_base<void_*,_std::pair<void_*const,_chaiscript::Type_Conversions::Conversion_Saves>,_std::allocator<std::pair<void_*const,_chaiscript::Type_Conversions::Conversion_Saves>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *this_00;
  Boxed_Value *in_RDX;
  Result_Type RVar1;
  Type_Conversions_State state;
  Type_Conversions_State local_30;
  
  this_00 = (_Map_base<void_*,_std::pair<void_*const,_chaiscript::Type_Conversions::Conversion_Saves>,_std::allocator<std::pair<void_*const,_chaiscript::Type_Conversions::Conversion_Saves>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             *)threading::Thread_Storage<chaiscript::Type_Conversions::Conversion_Saves>::t();
  local_30.m_saves._M_data =
       std::__detail::
       _Map_base<void_*,_std::pair<void_*const,_chaiscript::Type_Conversions::Conversion_Saves>,_std::allocator<std::pair<void_*const,_chaiscript::Type_Conversions::Conversion_Saves>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
       ::operator[](this_00,(key_type *)(bv + 0xc));
  local_30.m_conversions._M_data =
       (Type_Conversions *)
       &bv[2].m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount;
  RVar1 = chaiscript::boxed_cast<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>>
                    ((chaiscript *)this,in_RDX,&local_30);
  RVar1.
  super___shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  return (Result_Type)
         RVar1.
         super___shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

typename detail::Cast_Helper<Type>::Result_Type boxed_cast(const Boxed_Value &bv) const
          {
            Type_Conversions_State state(m_conversions, m_conversions.conversion_saves());
            return chaiscript::boxed_cast<Type>(bv, &state);
          }